

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeValidJointActions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,Index jt_bgI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *valid_JAs,BGIP_BnB_NodePtr *node)

{
  int *piVar1;
  uint uVar2;
  sp_counted_base *psVar3;
  Index IVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  undefined8 uVar6;
  size_type __n;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid_action_set;
  vector<unsigned_int,_std::allocator<unsigned_int>_> curr_JA;
  allocator_type local_81;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  element_type *local_48;
  shared_count asStack_40 [2];
  
  local_50 = valid_JAs;
  pvVar5 = BayesianGameBase::JointToIndividualTypeIndices
                     ((BayesianGameBase *)(this->_m_bgip).px,jt_bgI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_80,this->_m_nrAgents,&BGIP_BnB::UNSPECIFIED_ACTION,(allocator_type *)&local_68);
  __n = this->_m_nrAgents;
  if (__n != 0) {
    uVar7 = 0;
    do {
      uVar2 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      psVar3 = (node->pn).pi_;
      local_48 = node->px;
      asStack_40[0].pi_ = (node->pn).pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar3->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      IVar4 = *(Index *)(*(long *)&(this->_m_depthFirstSpecified).
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + (ulong)uVar2 * 4);
      boost::detail::shared_count::~shared_count(asStack_40);
      if (IVar4 <= *(uint *)(node->px + 0x20)) {
        IVar4 = BGIP_BnB_Node::GetSpecifiedAction(node->px,(Index)uVar7,IVar4);
        if ((ulong)((long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar7) {
          uVar6 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar7);
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar6);
        }
        local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = IVar4;
      }
      uVar7 = (ulong)((Index)uVar7 + 1);
      __n = this->_m_nrAgents;
    } while (uVar7 < __n);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,__n,&local_81);
  GenerateJointActions(this,&local_80,&local_68,local_50,0);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void 
    ComputeValidJointActions(
            Index jt_bgI, 
            std::vector<Index>& valid_JAs,
            BGIP_BnB_NodePtr node){
    const std::vector<Index> &indTypes=
        _m_bgip->JointToIndividualTypeIndices(jt_bgI);

#if DEBUG_VALID_ACTIONS            
    std::cout << "\tComputing valid JAs for indTypes=" <<
        SoftPrintVector(indTypes) << std::endl;
#endif

    //  valid_action_set[agI] stores the valid action for agent i
    std::vector< Index > valid_action_set(_m_nrAgents, UNSPECIFIED_ACTION);
    for(Index agI=0; agI < _m_nrAgents; agI++)
    {
        Index tI = indTypes[agI];
#if CACHE_IMPLIED_JPOL
        valid_action_set.at(agI) = _m_impliedJPol.at(agI).at(tI);
#else            
        //should be pre-computed with the ordering:
        Index depth_tI = GetDepthFirstSpecified(agI,tI,node);
        Index depth_node = node->GetDepth(); //this node's depth
#if DEBUG_VALID_ACTIONS            
        std::cout << "\tagent "<<agI<<"'s type ( tI="<<tI
                  <<" ) is first specified at depth_tI "<< depth_tI << std::endl;
        std::cout << "\tthis node's depth_node is " << depth_node << std::endl;
#endif
        if( depth_tI <= depth_node )
            //when depth_tI == depth_node, then *this* node specifies the 
            //action for tI. This means that the valid joint actions that 
            //can be assigned to children nodes of this node, are 
            //constrained!
            valid_action_set.at(agI) = node->GetSpecifiedAction(agI, depth_tI);
        else
        {
            ;
            //we do nothing because
            //  valid_action_set[agI] = {1,...,GetNrActions(agI) }
            //is encoded by valid_action_set[agI] = UNSPECIFIED_ACTION
            //(which is set already)
        }
#endif
#if DEBUG_VALID_ACTIONS            
        std::cout <<"\tvalid action for agI "<<agI<<" is " << 
            valid_action_set.at(agI) << std::endl;
#endif
    }
    std::vector<Index> curr_JA(_m_nrAgents);
    GenerateJointActions(valid_action_set,curr_JA, valid_JAs, 0);
#if DEBUG_VALID_ACTIONS            
    std::cout <<"Generated the following valid_JAs:"<<SoftPrintVector(valid_JAs)<<endl;
#endif
    //return(valid_JAs);
}